

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  uint uVar2;
  TRef TVar3;
  TRef TVar4;
  long lVar5;
  GCobj *o;
  IRRef1 IVar6;
  TValue *pTVar7;
  uint *puVar8;
  ulong uVar9;
  void *ptr;
  RecordIndex ix;
  TValue local_78 [3];
  TValue local_60 [3];
  uint local_48;
  uint local_38;
  
  uVar9 = (ulong)func;
  pTVar7 = J->L->base + uVar9;
  puVar8 = J->base + uVar9;
  if (-1 < nargs) {
    lVar5 = nargs + 1;
    do {
      if (J->base[uVar9] == 0) {
        sload(J,(int32_t)uVar9);
      }
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  if ((*puVar8 & 0x1f000000) != 0x8000000) {
    local_78[0].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar7;
    local_48 = *puVar8;
    iVar1 = lj_record_mm_lookup(J,(RecordIndex *)&local_78[0].field_2,MM_call);
    if ((iVar1 == 0) || ((local_38 & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J,LJ_TRERR_NOMM);
    }
    if (-1 < nargs) {
      lVar5 = nargs + 2;
      do {
        puVar8[lVar5 + -1] = puVar8[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    nargs = nargs + 1;
    *puVar8 = local_38;
    pTVar7 = local_60;
  }
  o = (GCobj *)(ulong)(pTVar7->u32).lo;
  uVar2 = *puVar8;
  IVar6 = (IRRef1)uVar2;
  if (((o->gch).unused1 == '\0') &&
     (ptr = (void *)(ulong)(o->gch).metatable.gcptr32, 0x5f < *(byte *)((long)ptr + -0x1b))) {
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050002;
    TVar3 = lj_opt_fold(J);
    TVar4 = lj_ir_kptr_(J,IR_KPTR,ptr);
    (J->fold).ins.field_0.ot = 0x885;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    lj_ir_kgc(J,(GCobj *)((long)ptr + -0x40),IRT_PROTO);
  }
  else {
    uVar2 = lj_ir_kgc(J,o,IRT_FUNC);
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = IVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar2;
    lj_opt_fold(J);
  }
  *puVar8 = uVar2 | 0x10000;
  J->maxslot = (BCReg)nargs;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef *fbase = &J->base[func];
  ptrdiff_t i;
  for (i = 0; i <= nargs; i++)
    (void)getslot(J, func+i);  /* Ensure func and all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > 0; i--)  /* Shift arguments up. */
      fbase[i] = fbase[i-1];
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  fbase[0] = TREF_FRAME | rec_call_specialize(J, funcV(functv), fbase[0]);
  J->maxslot = (BCReg)nargs;
}